

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O2

int __thiscall ncnn::PriorBox::load_param(PriorBox *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  Mat local_b0;
  Mat local_68;
  
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b0,pd,0,&local_68);
  Mat::operator=(&this->min_sizes,&local_b0);
  Mat::~Mat(&local_b0);
  Mat::~Mat(&local_68);
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b0,pd,1,&local_68);
  Mat::operator=(&this->max_sizes,&local_b0);
  Mat::~Mat(&local_b0);
  Mat::~Mat(&local_68);
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b0,pd,2,&local_68);
  Mat::operator=(&this->aspect_ratios,&local_b0);
  Mat::~Mat(&local_b0);
  Mat::~Mat(&local_68);
  fVar2 = ParamDict::get(pd,3,0.1);
  this->variances[0] = fVar2;
  fVar2 = ParamDict::get(pd,4,0.1);
  this->variances[1] = fVar2;
  fVar2 = ParamDict::get(pd,5,0.2);
  this->variances[2] = fVar2;
  fVar2 = ParamDict::get(pd,6,0.2);
  this->variances[3] = fVar2;
  iVar1 = ParamDict::get(pd,7,1);
  this->flip = iVar1;
  iVar1 = ParamDict::get(pd,8,0);
  this->clip = iVar1;
  iVar1 = ParamDict::get(pd,9,0);
  this->image_width = iVar1;
  iVar1 = ParamDict::get(pd,10,0);
  this->image_height = iVar1;
  fVar2 = ParamDict::get(pd,0xb,-233.0);
  this->step_width = fVar2;
  fVar2 = ParamDict::get(pd,0xc,-233.0);
  this->step_height = fVar2;
  fVar2 = ParamDict::get(pd,0xd,0.0);
  this->offset = fVar2;
  iVar1 = ParamDict::get(pd,0xe,0);
  this->step_mmdetection = iVar1 != 0;
  iVar1 = ParamDict::get(pd,0xf,0);
  this->center_mmdetection = iVar1 != 0;
  return 0;
}

Assistant:

int PriorBox::load_param(const ParamDict& pd)
{
    min_sizes = pd.get(0, Mat());
    max_sizes = pd.get(1, Mat());
    aspect_ratios = pd.get(2, Mat());
    variances[0] = pd.get(3, 0.1f);
    variances[1] = pd.get(4, 0.1f);
    variances[2] = pd.get(5, 0.2f);
    variances[3] = pd.get(6, 0.2f);
    flip = pd.get(7, 1);
    clip = pd.get(8, 0);
    image_width = pd.get(9, 0);
    image_height = pd.get(10, 0);
    step_width = pd.get(11, -233.f);
    step_height = pd.get(12, -233.f);
    offset = pd.get(13, 0.f);
    step_mmdetection = pd.get(14, 0);
    center_mmdetection = pd.get(15, 0);

    return 0;
}